

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O2

string * __thiscall
rtc::hex_encode_with_delimiter_abi_cxx11_
          (string *__return_storage_ptr__,rtc *this,char *source,size_t srclen,char delimiter)

{
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  char *buffer;
  undefined8 uStack_1a0;
  FatalMessage local_198;
  
  lVar1 = -((long)source * 3 + 0xfU & 0xfffffffffffffff0);
  buffer = (char *)((long)&local_198 + lVar1);
  *(undefined8 *)((long)&uStack_1a0 + lVar1) = 0x148570;
  sVar2 = hex_encode_with_delimiter
                    (buffer,(long)source * 3,(char *)this,(size_t)source,(char)srclen);
  if (sVar2 != 0 || source == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined8 *)((long)&uStack_1a0 + lVar1) = 0x148598;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,buffer,buffer + sVar2);
    return __return_storage_ptr__;
  }
  *(undefined8 *)((long)&uStack_1a0 + lVar1) = 0x1485c1;
  FatalMessage::FatalMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
             ,0x1e3);
  *(undefined8 *)((long)&uStack_1a0 + lVar1) = 0x1485d0;
  poVar3 = std::operator<<((ostream *)&local_198,"Check failed: srclen == 0 || length > 0");
  *(undefined8 *)((long)&uStack_1a0 + lVar1) = 0x1485d8;
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  *(undefined8 *)((long)&uStack_1a0 + lVar1) = 0x1485e7;
  std::operator<<(poVar3,"# ");
  *(code **)((long)&uStack_1a0 + lVar1) = hex_decode;
  FatalMessage::~FatalMessage(&local_198);
}

Assistant:

std::string hex_encode_with_delimiter(const char* source, size_t srclen,
                                      char delimiter) {
  const size_t kBufferSize = srclen * 3;
  char* buffer = STACK_ARRAY(char, kBufferSize);
  size_t length = hex_encode_with_delimiter(buffer, kBufferSize,
                                            source, srclen, delimiter);
  RTC_DCHECK(srclen == 0 || length > 0);
  return std::string(buffer, length);
}